

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O2

FlatFilePos __thiscall
node::BlockManager::SaveBlockToDisk(BlockManager *this,CBlock *block,int nHeight)

{
  Notifications *pNVar1;
  bool bVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  FlatFilePos blockPos;
  bilingual_str local_60;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_60.original._M_dataplus._M_p = &::TX_WITH_WITNESS.allow_witness;
  local_60.original._M_string_length = (size_type)block;
  sVar3 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CBlock_const>>
                    ((ParamsWrapper<TransactionSerParams,_const_CBlock> *)&local_60);
  blockPos = FindNextBlockPos(this,(int)sVar3 + 8,nHeight,(ulong)(block->super_CBlockHeader).nTime);
  if (blockPos.nFile == -1) {
    logging_function._M_str = "SaveBlockToDisk";
    logging_function._M_len = 0xf;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file._M_len = 0x65;
    LogPrintFormatInternal<char[16]>
              (logging_function,source_file,0x46a,ALL,Error,(ConstevalFormatString<1U>)0x68d800,
               (char (*) [16])"SaveBlockToDisk");
  }
  else {
    bVar2 = WriteBlockToDisk(this,block,&blockPos);
    if (bVar2) {
      uVar4 = (ulong)blockPos & 0xffffffff00000000;
      uVar5 = (ulong)blockPos & 0xffffffff;
      goto LAB_001e129c;
    }
    pNVar1 = (this->m_opts).notifications;
    _(&local_60,(ConstevalStringLiteral)0x68d81d);
    (*pNVar1->_vptr_Notifications[8])(pNVar1,&local_60);
    bilingual_str::~bilingual_str(&local_60);
  }
  uVar5 = 0xffffffff;
  uVar4 = 0;
LAB_001e129c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (FlatFilePos)(uVar4 | uVar5);
  }
  __stack_chk_fail();
}

Assistant:

FlatFilePos BlockManager::SaveBlockToDisk(const CBlock& block, int nHeight)
{
    unsigned int nBlockSize = ::GetSerializeSize(TX_WITH_WITNESS(block));
    // Account for the 4 magic message start bytes + the 4 length bytes (8 bytes total,
    // defined as BLOCK_SERIALIZATION_HEADER_SIZE)
    nBlockSize += static_cast<unsigned int>(BLOCK_SERIALIZATION_HEADER_SIZE);
    FlatFilePos blockPos{FindNextBlockPos(nBlockSize, nHeight, block.GetBlockTime())};
    if (blockPos.IsNull()) {
        LogError("%s: FindNextBlockPos failed\n", __func__);
        return FlatFilePos();
    }
    if (!WriteBlockToDisk(block, blockPos)) {
        m_opts.notifications.fatalError(_("Failed to write block."));
        return FlatFilePos();
    }
    return blockPos;
}